

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::doShowObj(QPDFJob *this,QPDF *pdf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  Pipeline *pPVar4;
  runtime_error *this_01;
  int encode_flags;
  qpdf_stream_decode_level_e decode_level;
  undefined1 local_88 [32];
  QPDFObjectHandle local_68;
  string local_50;
  QPDFObjectHandle local_30;
  
  local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->show_trailer == true) {
    QPDF::getTrailer(pdf);
  }
  else {
    QPDF::getObjectByID((QPDF *)local_88,(int)pdf,peVar3->show_obj);
  }
  this_00._M_pi =
       local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
  local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88._0_8_;
  local_88._0_8_ =
       (__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>)0x0;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  bVar1 = QPDFObjectHandle::isStream(&local_68);
  if (bVar1) {
    peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar1 = peVar3->show_filtered_stream_data;
    if ((peVar3->show_raw_stream_data == false) && ((bVar1 & 1U) == 0)) {
      QPDFLogger::getInfo((QPDFLogger *)&local_50,
                          SUB81((peVar3->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      pPVar4 = Pipeline::operator<<
                         ((Pipeline *)local_50._M_dataplus._M_p,"Object is stream.  Dictionary:\n");
      QPDFObjectHandle::getDict(&local_30);
      QPDFObjectHandle::unparseResolved_abi_cxx11_((string *)local_88,&local_30);
      pPVar4 = Pipeline::operator<<(pPVar4,(string *)local_88);
      Pipeline::operator<<(pPVar4,"\n");
      if (local_88._0_8_ != (long)local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      if (local_30.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    else {
      if ((bVar1 & 1U) != 0) {
        bVar2 = QPDFObjectHandle::pipeStreamData
                          (&local_68,(Pipeline *)0x0,0,qpdf_dl_all,false,false);
        if (!bVar2) {
          local_88._0_8_ = (long)local_88 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_88,"unable to filter stream data","");
          QPDFObjectHandle::warnIfPossible(&local_68,(string *)local_88);
          if (local_88._0_8_ != (long)local_88 + 0x10) {
            operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
          }
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_30.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)QPDFObjectHandle::getObjGen(&local_68);
          QPDFObjGen::unparse_abi_cxx11_(&local_50,(QPDFObjGen *)&local_30,',');
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88,"unable to get object ",&local_50);
          std::runtime_error::runtime_error(this_01,(string *)local_88);
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      QPDFLogger::saveToStandardOutput
                ((peVar3->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 true);
      decode_level = qpdf_dl_none;
      QPDFLogger::getSave((QPDFLogger *)local_88,
                          SUB81((((this->m).
                                  super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      encode_flags = 0;
      if ((bVar1 & 1U) != 0) {
        encode_flags = (uint)((this->m).
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->normalize * 2;
        decode_level = qpdf_dl_all;
      }
      QPDFObjectHandle::pipeStreamData
                (&local_68,(Pipeline *)local_88._0_8_,encode_flags,decode_level,false,false);
      local_50._M_string_length = local_88._8_8_;
    }
  }
  else {
    QPDFLogger::getInfo((QPDFLogger *)&local_50,
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    QPDFObjectHandle::unparseResolved_abi_cxx11_((string *)local_88,&local_68);
    pPVar4 = Pipeline::operator<<((Pipeline *)local_50._M_dataplus._M_p,(string *)local_88);
    Pipeline::operator<<(pPVar4,"\n");
    if ((Members *)local_88._0_8_ != (Members *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
  }
  if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDFJob::doShowObj(QPDF& pdf)
{
    QPDFObjectHandle obj;
    if (m->show_trailer) {
        obj = pdf.getTrailer();
    } else {
        obj = pdf.getObjectByID(m->show_obj, m->show_gen);
    }
    bool error = false;
    if (obj.isStream()) {
        if (m->show_raw_stream_data || m->show_filtered_stream_data) {
            bool filter = m->show_filtered_stream_data;
            if (filter && (!obj.pipeStreamData(nullptr, 0, qpdf_dl_all))) {
                QTC::TC("qpdf", "QPDFJob unable to filter");
                obj.warnIfPossible("unable to filter stream data");
                error = true;
            } else {
                // If anything has been written to standard output, this will fail.
                m->log->saveToStandardOutput(true);
                obj.pipeStreamData(
                    m->log->getSave().get(),
                    (filter && m->normalize) ? qpdf_ef_normalize : 0,
                    filter ? qpdf_dl_all : qpdf_dl_none);
            }
        } else {
            *m->log->getInfo() << "Object is stream.  Dictionary:\n"
                               << obj.getDict().unparseResolved() << "\n";
        }
    } else {
        *m->log->getInfo() << obj.unparseResolved() << "\n";
    }
    if (error) {
        throw std::runtime_error("unable to get object " + obj.getObjGen().unparse(','));
    }
}